

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

Test * DyndepParserTestOutBadRule::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x218);
  DyndepParserTestOutBadRule((DyndepParserTestOutBadRule *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DyndepParserTest, OutBadRule) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: touch";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: expected build command name 'dyndep'\n"
            "build out: touch\n"
            "           ^ near here", err);
}